

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O1

void __thiscall
cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::on_string
          (tag_scalar_t<int,_cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  tag_t<cfgfile::string_trait_t> **pptVar1;
  constraint_t<int> *pcVar2;
  int iVar3;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  _Var4;
  exception_t<cfgfile::string_trait_t> *peVar5;
  pos_t pos;
  pos_t pos_00;
  pos_t pos_01;
  int value;
  int local_2d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 *local_290;
  long local_288;
  undefined1 local_280 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 *local_250;
  long local_248;
  undefined1 local_240 [16];
  string_t local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string_t local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->super_tag_t<cfgfile::string_trait_t>).m_is_defined != false) {
    peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Value for the tag \"","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    std::operator+(&local_150,&local_190,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    local_250 = local_240;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"\" already defined. In file \"","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_210,local_250,local_250 + local_248);
    std::operator+(&local_130,&local_150,&local_210);
    std::operator+(&local_110,&local_130,&info->m_file_name);
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"\" on line ","");
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_270,local_290,local_290 + local_288);
    std::operator+(&local_f0,&local_110,&local_270);
    string_trait_t::to_string_abi_cxx11_(&local_230,(string_trait_t *)info->m_line_number,pos);
    std::operator+(&local_d0,&local_f0,&local_230);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,".","");
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d0,local_2b0._M_dataplus._M_p,
               local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
    std::operator+(&local_90,&local_d0,&local_2d0);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_90);
    __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  pptVar1 = (this->super_tag_t<cfgfile::string_trait_t>).m_child_tags.
            super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>>,__gnu_cxx::__ops::_Iter_pred<cfgfile::tag_t<cfgfile::string_trait_t>::is_any_child_defined()const::_lambda(cfgfile::tag_t<cfgfile::string_trait_t>*)_1_>>
                    ((this->super_tag_t<cfgfile::string_trait_t>).m_child_tags.
                     super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,pptVar1);
  if (_Var4._M_current == pptVar1) {
    local_2d4 = format_t<int,_cfgfile::string_trait_t>::from_string(info,str);
    pcVar2 = this->m_constraint;
    if (pcVar2 != (constraint_t<int> *)0x0) {
      iVar3 = (*pcVar2->_vptr_constraint_t[2])(pcVar2,&local_2d4);
      if ((char)iVar3 == '\0') {
        peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
        local_250 = local_240;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Invalid value: \"","")
        ;
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,local_250,local_250 + local_248);
        std::operator+(&local_1b0,&local_210,str);
        local_290 = local_280;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"\". Value must match to the constraint in tag \"","");
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_290,local_290 + local_288);
        std::operator+(&local_190,&local_1b0,&local_270);
        std::operator+(&local_150,&local_190,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"\". In file \"","");
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,local_2d0._M_dataplus._M_p,
                   local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
        std::operator+(&local_130,&local_150,&local_230);
        std::operator+(&local_110,&local_130,&info->m_file_name);
        local_1d0 = local_1c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"\" on line ","");
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b0,local_1d0,local_1d0 + local_1c8);
        std::operator+(&local_f0,&local_110,&local_2b0);
        string_trait_t::to_string_abi_cxx11_(&local_b0,(string_trait_t *)info->m_line_number,pos_01)
        ;
        std::operator+(&local_d0,&local_f0,&local_b0);
        local_1f0 = local_1e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,".","");
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_1f0,local_1f0 + local_1e8);
        std::operator+(&local_70,&local_d0,&local_170);
        exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_70);
        __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                    exception_t<cfgfile::string_trait_t>::~exception_t);
      }
    }
    this->m_value = local_2d4;
    (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
    return;
  }
  peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Value \"","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_210,local_250,local_250 + local_248);
  std::operator+(&local_1b0,&local_210,str);
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"\" for tag \"","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_270,local_290,local_290 + local_288);
  std::operator+(&local_190,&local_1b0,&local_270);
  std::operator+(&local_150,&local_190,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,"\" must be defined before any child tag. In file \"","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_2d0._M_dataplus._M_p,
             local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
  std::operator+(&local_130,&local_150,&local_230);
  std::operator+(&local_110,&local_130,&info->m_file_name);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"\" on line ","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2b0,local_1d0,local_1d0 + local_1c8);
  std::operator+(&local_f0,&local_110,&local_2b0);
  string_trait_t::to_string_abi_cxx11_(&local_b0,(string_trait_t *)info->m_line_number,pos_00);
  std::operator+(&local_d0,&local_f0,&local_b0);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,".","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_1f0,local_1f0 + local_1e8);
  std::operator+(&local_50,&local_d0,&local_170);
  exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_50);
  __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( !this->is_defined_member_value() )
		{
			if( this->is_any_child_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Value \"" ) + str +
					Trait::from_ascii( "\" for tag \"" ) + this->name() +
					Trait::from_ascii( "\" must be defined before any "
						"child tag. In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );

			T value = format_t< T, Trait >::from_string( info, str );

			if( m_constraint )
			{
				if( !m_constraint->check( value ) )
					throw exception_t< Trait >(
						Trait::from_ascii( "Invalid value: \"" ) +
						str +
						Trait::from_ascii( "\". Value must match to the "
							"constraint in tag \"" ) +
						this->name() + Trait::from_ascii( "\". In file \"" ) +
						info.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( info.line_number() ) +
						Trait::from_ascii( "." ) );
			}

			m_value = value;

			this->set_defined();
		}
		else
			throw exception_t< Trait >(
				Trait::from_ascii( "Value for the tag \"" ) +
				this->name() +
				Trait::from_ascii( "\" already defined. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );
	}